

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::writeData
          (AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
          ostream *stream,string *errorMessage,DataHandling dataHandling)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  undefined8 uVar4;
  undefined4 in_ECX;
  ostream *in_RSI;
  Vector3<double> *in_RDI;
  int i;
  size_t count;
  Vector3d dat;
  Accumulator<OpenMD::Vector<double,_3U>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Vector<double,_3U> local_a8;
  uint local_8c;
  size_t local_40;
  Vector<double,_3U> local_38;
  undefined4 local_1c;
  ostream *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x348b40);
  local_40 = Accumulator<OpenMD::Vector<double,_3U>_>::getCount
                       ((Accumulator<OpenMD::Vector<double,_3U>_> *)
                        ((in_RDI->super_Vector<double,_3U>).data_ + 1));
  switch(local_1c) {
  case 0:
    Accumulator<OpenMD::Vector<double,_3U>_>::getAverage(in_stack_ffffffffffffff38);
    Vector3<double>::operator=
              (in_RDI,(Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    break;
  case 1:
    Accumulator<OpenMD::Vector<double,_3U>_>::getLastValue(in_stack_ffffffffffffff38);
    Vector3<double>::operator=
              (in_RDI,(Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    break;
  case 2:
  case 3:
    snprintf(painCave.errMsg,2000,"%s",
             "Max and Min functions are not defined for a std::vector Accumulator.");
    painCave.isFatal = 1;
    simError();
    break;
  case 4:
    Accumulator<OpenMD::Vector<double,_3U>_>::getTotal(in_stack_ffffffffffffff38);
    Vector3<double>::operator=
              (in_RDI,(Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  local_8c = 0;
  do {
    uVar2 = local_8c;
    Accumulator<OpenMD::Vector<double,_3U>_>::getAverage(in_stack_ffffffffffffff38);
    uVar1 = Vector<double,_3U>::size(&local_a8);
    if (uVar1 <= uVar2) {
      return;
    }
    pdVar3 = Vector<double,_3U>::operator[](&local_38,local_8c);
    uVar2 = std::isinf(*pdVar3);
    if ((uVar2 & 1) == 0) {
      pdVar3 = Vector<double,_3U>::operator[](&local_38,local_8c);
      uVar2 = std::isnan(*pdVar3);
      if ((uVar2 & 1) != 0) goto LAB_00348cad;
      if (local_40 == 0) {
        std::operator<<(local_10,"\t");
      }
      else {
        in_stack_ffffffffffffff38 =
             (Accumulator<OpenMD::Vector<double,_3U>_> *)std::operator<<(local_10,"\t");
        pdVar3 = Vector<double,_3U>::operator[](&local_38,local_8c);
        std::ostream::operator<<(in_stack_ffffffffffffff38,*pdVar3);
      }
    }
    else {
LAB_00348cad:
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"%s",uVar4);
      painCave.isFatal = 1;
      simError();
    }
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      Vector3d dat;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = Vector3dAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = Vector3dAccumulator::getLastValue();
        break;
      case DataHandling::Total:
        dat = Vector3dAccumulator::getTotal();
        break;
      case DataHandling::Max:
      case DataHandling::Min:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                 "Max and Min functions are not defined for a "
                 "std::vector Accumulator.");
        painCave.isFatal = 1;
        simError();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (std::isinf(dat[i]) || std::isnan(dat[i])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << "\t";
          else
            stream << "\t" << dat[i];
        }
      }
    }